

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::IOBlock::declareArray
          (string *__return_storage_ptr__,IOBlock *this,string *sizeExpr)

{
  pointer pMVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  DeclareVariable local_1e8;
  ostringstream buf;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf);
  poVar2 = std::operator<<((ostream *)&buf,(string *)&this->m_blockName);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"{\n");
  lVar3 = 0;
  for (lVar4 = 0;
      lVar4 < (int)(((long)(this->m_members).
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_members).
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x38); lVar4 = lVar4 + 1) {
    poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"\t");
    pMVar1 = (this->m_members).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
             ._M_impl.super__Vector_impl_data._M_start;
    glu::decl::DeclareVariable::DeclareVariable
              (&local_1e8,(VarType *)((long)&(pMVar1->type).m_type + lVar3),
               (string *)((long)&(pMVar1->name)._M_dataplus._M_p + lVar3),0);
    poVar2 = glu::decl::operator<<(poVar2,&local_1e8);
    std::operator<<(poVar2,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_1e8);
    lVar3 = lVar3 + 0x38;
  }
  poVar2 = std::operator<<(&buf.super_basic_ostream<char,_std::char_traits<char>_>,"} ");
  poVar2 = std::operator<<(poVar2,(string *)&this->m_interfaceName);
  poVar2 = std::operator<<(poVar2,"[");
  poVar2 = std::operator<<(poVar2,(string *)sizeExpr);
  std::operator<<(poVar2,"];\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buf);
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::IOBlock::declareArray (const string& sizeExpr) const
{
	std::ostringstream buf;

	buf << m_blockName << "\n"
		<< "{\n";

	for (int i = 0; i < (int)m_members.size(); i++)
		buf << "\t" << glu::declare(m_members[i].type, m_members[i].name) << ";\n";

	buf << "} " << m_interfaceName << "[" << sizeExpr << "];\n";
	return buf.str();
}